

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::LipidTransVisitor::internalVisit(LipidTransVisitor *this,StuntDouble *sd)

{
  double *pdVar1;
  double *pdVar2;
  uint i;
  long lVar3;
  RotMat3x3d *pRVar4;
  uint i_1;
  uint j;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar7;
  long *plVar8;
  Vector<double,_3U> result;
  double *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _func_int **local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  Vector3d local_58;
  Snapshot *local_38;
  
  pdVar1 = local_58.super_Vector<double,_3U>.data_ + 2;
  local_58.super_Vector<double,_3U>.data_[0] = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)&local_88,(string *)sd);
  p_Var6 = p_Stack_80;
  pdVar2 = local_88;
  local_88 = (double *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((double *)local_58.super_Vector<double,_3U>.data_[0] != pdVar1) {
    operator_delete((void *)local_58.super_Vector<double,_3U>.data_[0],
                    (long)local_58.super_Vector<double,_3U>.data_[2] + 1);
  }
  if (((_func_int **)pdVar2 == (_func_int **)0x0) ||
     (local_60 = __dynamic_cast(pdVar2,&GenericData::typeinfo,&AtomData::typeinfo), local_60 == 0))
  {
    if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
  }
  else {
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    plVar8 = *(long **)(local_60 + 0x28);
    if (plVar8 != *(long **)(local_60 + 0x30)) {
      local_38 = this->info_->sman_->currentSnapshot_;
      lVar7 = *plVar8;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_68 = p_Var6;
      if (lVar7 != 0) {
        p_Var6 = this_00;
        do {
          local_88 = (double *)0x0;
          p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78 = (_func_int **)0x0;
          lVar3 = 0;
          do {
            (&local_88)[lVar3] =
                 (double *)
                 (*(double *)(lVar7 + 0x28 + lVar3 * 8) -
                 (this->origin_).super_Vector<double,_3U>.data_[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_58.super_Vector<double,_3U>.data_[2] = (double)local_78;
          local_58.super_Vector<double,_3U>.data_[0] = (double)local_88;
          local_58.super_Vector<double,_3U>.data_[1] = (double)p_Stack_80;
          Snapshot::wrapVector(local_38,&local_58);
          local_88 = (double *)0x0;
          p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78 = (_func_int **)0x0;
          lVar3 = 0;
          pRVar4 = &this->rotMat_;
          do {
            pdVar1 = (&local_88)[lVar3];
            lVar5 = 0;
            do {
              pdVar1 = (double *)
                       ((double)pdVar1 +
                       (pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][lVar5] * local_58.super_Vector<double,_3U>.data_[lVar5]);
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            (&local_88)[lVar3] = pdVar1;
            lVar3 = lVar3 + 1;
            pRVar4 = (RotMat3x3d *)
                     ((pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     + 1);
          } while (lVar3 != 3);
          lVar3 = 0;
          do {
            *(double **)(lVar7 + 0x28 + lVar3 * 8) = (&local_88)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_88 = (double *)0x0;
          p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78 = (_func_int **)0x0;
          lVar3 = 0;
          pRVar4 = &this->rotMat_;
          do {
            pdVar1 = (&local_88)[lVar3];
            lVar5 = 0;
            do {
              pdVar1 = (double *)
                       ((double)pdVar1 +
                       (pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][lVar5] * *(double *)(lVar7 + 0x40 + lVar5 * 8));
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            (&local_88)[lVar3] = pdVar1;
            lVar3 = lVar3 + 1;
            pRVar4 = (RotMat3x3d *)
                     ((pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     + 1);
          } while (lVar3 != 3);
          lVar3 = 0;
          do {
            *(double **)(lVar7 + 0x40 + lVar3 * 8) = (&local_88)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          if (plVar8 + 2 == *(long **)(local_60 + 0x30)) {
            lVar7 = 0;
LAB_00219d8a:
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            lVar7 = plVar8[2];
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[3];
            if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00219d8a;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          p_Var6 = this_00;
          plVar8 = plVar8 + 2;
        } while (lVar7 != 0);
      }
      p_Var6 = local_68;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  return;
}

Assistant:

void LipidTransVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d tmp = atomInfo->pos - origin_;
      currSnapshot->wrapVector(tmp);
      atomInfo->pos = rotMat_ * tmp;
      ;
      atomInfo->vec = rotMat_ * atomInfo->vec;
    }
  }